

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast_withPrefix64k(char *source,char *dest,int originalSize)

{
  ushort uVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  ushort *puVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  ushort *local_48;
  char *local_40;
  char *local_38;
  
  pcVar6 = dest + originalSize;
  local_38 = dest + -0x10000;
  local_48 = (ushort *)source;
  local_40 = source;
  while( true ) {
    puVar5 = (ushort *)((long)local_48 + 1);
    uVar1 = *local_48;
    uVar7 = (uint)(byte)((byte)uVar1 >> 4);
    uVar8 = (ulong)uVar7;
    local_48 = puVar5;
    if (uVar7 == 0xf) {
      sVar2 = read_long_length_no_check((BYTE **)&local_48);
      uVar8 = sVar2 + 0xf;
    }
    puVar5 = local_48;
    if ((ulong)((long)pcVar6 - (long)dest) < uVar8) {
      return -1;
    }
    memmove(dest,local_48,uVar8);
    pcVar9 = dest + uVar8;
    puVar5 = (ushort *)((long)puVar5 + uVar8);
    if ((ulong)((long)pcVar6 - (long)pcVar9) < 0xc) {
      if (pcVar9 == pcVar6) {
        return (int)puVar5 - (int)local_40;
      }
      return -1;
    }
    uVar8 = (ulong)((byte)uVar1 & 0xf);
    uVar1 = *puVar5;
    local_48 = puVar5 + 1;
    if (uVar8 == 0xf) {
      sVar2 = read_long_length_no_check((BYTE **)&local_48);
      uVar8 = sVar2 + 0xf;
    }
    uVar8 = uVar8 + 4;
    if ((ulong)((long)pcVar6 - (long)pcVar9) < uVar8) break;
    if ((ulong)((long)pcVar9 - (long)local_38) < (ulong)uVar1) {
      return -1;
    }
    pcVar3 = pcVar9;
    uVar4 = uVar8;
    while (bVar10 = uVar4 != 0, uVar4 = uVar4 - 1, bVar10) {
      *pcVar3 = pcVar3[-(ulong)uVar1];
      pcVar3 = pcVar3 + 1;
    }
    dest = pcVar9 + uVar8;
    if ((ulong)((long)pcVar6 - (long)dest) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

int LZ4_decompress_fast_withPrefix64k(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                64 KB, NULL, 0);
}